

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RemoveColumnInfo::Deserialize(RemoveColumnInfo *this,Deserializer *deserializer)

{
  RemoveColumnInfo *this_00;
  pointer pRVar1;
  _Head_base<0UL,_duckdb::RemoveColumnInfo_*,_false> local_20;
  
  this_00 = (RemoveColumnInfo *)operator_new(0xa0);
  RemoveColumnInfo(this_00);
  local_20._M_head_impl = this_00;
  pRVar1 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"removed_column",&pRVar1->removed_column);
  pRVar1 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x191,"if_column_exists",&pRVar1->if_column_exists);
  pRVar1 = unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
           ::operator->((unique_ptr<duckdb::RemoveColumnInfo,_std::default_delete<duckdb::RemoveColumnInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x192,"cascade",&pRVar1->cascade);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RemoveColumnInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RemoveColumnInfo>(new RemoveColumnInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "removed_column", result->removed_column);
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_exists", result->if_column_exists);
	deserializer.ReadPropertyWithDefault<bool>(402, "cascade", result->cascade);
	return std::move(result);
}